

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O2

learner<cbify,_example> *
LEARNER::
init_cost_sensitive_learner<cbify,example,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
          (free_ptr<cbify> *dat,
          learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *base,
          _func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
          *learn,_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_example_ptr
                 *predict,parser *p,size_t ws,prediction_type_t pred_type)

{
  learner<cbify,_example> *plVar1;
  long lVar2;
  undefined **ppuVar3;
  label_parser *plVar4;
  byte bVar5;
  
  bVar5 = 0;
  plVar1 = learner<cbify,example>::
           init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                     ((dat->_M_t).super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_cbify_*,_false>._M_head_impl,base,learn,predict,ws,
                      pred_type);
  (dat->_M_t).super___uniq_ptr_impl<cbify,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_cbify_*,_void_(*)(void_*)>.super__Head_base<0UL,_cbify_*,_false>.
  _M_head_impl = (cbify *)0x0;
  *(undefined8 *)(plVar1 + 0x58) = *(undefined8 *)(plVar1 + 0x18);
  *(code **)(plVar1 + 0x68) = COST_SENSITIVE::finish_example<cbify>;
  ppuVar3 = &COST_SENSITIVE::cs_label;
  plVar4 = &p->lp;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    plVar4->default_label = (_func_void_void_ptr *)*ppuVar3;
    ppuVar3 = ppuVar3 + (ulong)bVar5 * -2 + 1;
    plVar4 = (label_parser *)((long)plVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return plVar1;
}

Assistant:

learner<T, E>& init_cost_sensitive_learner(free_ptr<T>& dat, L* base, void (*learn)(T&, L&, E&),
    void (*predict)(T&, L&, E&), parser* p, size_t ws,
    prediction_type::prediction_type_t pred_type = prediction_type::multiclass)
{
  learner<T, E>& l = learner<T, E>::init_learner(dat.get(), base, learn, predict, ws, pred_type);
  dat.release();
  l.set_finish_example(COST_SENSITIVE::finish_example);
  p->lp = COST_SENSITIVE::cs_label;
  return l;
}